

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextformat.h
# Opt level: O3

bool QtPrivate::QEqualityOperatorForType<QTextLength,_true>::equals
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (*a == *b) {
    dVar4 = *(double *)((long)a + 8);
    dVar3 = *(double *)((long)b + 8);
    uVar1 = -(ulong)(dVar4 < -dVar4);
    dVar5 = dVar4 - dVar3;
    uVar2 = -(ulong)(dVar5 < -dVar5);
    dVar4 = (double)(~uVar1 & (ulong)dVar4 | (ulong)-dVar4 & uVar1);
    uVar1 = -(ulong)(dVar3 < -dVar3);
    dVar3 = (double)(~uVar1 & (ulong)dVar3 | (ulong)-dVar3 & uVar1);
    if (dVar3 <= dVar4) {
      dVar4 = dVar3;
    }
    return (double)(~uVar2 & (ulong)dVar5 | (ulong)-dVar5 & uVar2) * 1000000000000.0 <= dVar4;
  }
  return false;
}

Assistant:

inline bool operator==(const QTextLength &other) const
    { return lengthType == other.lengthType
             && qFuzzyCompare(fixedValueOrPercentage, other.fixedValueOrPercentage); }